

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseSharpComment(AsciiParser *this)

{
  bool bVar1;
  char local_19;
  AsciiParser *pAStack_18;
  char c;
  AsciiParser *this_local;
  
  pAStack_18 = this;
  bVar1 = Char1(this,&local_19);
  if (bVar1) {
    if (local_19 == '#') {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseSharpComment() {
  char c;
  if (!Char1(&c)) {
    // eol
    return false;
  }

  if (c != '#') {
    return false;
  }

  return true;
}